

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::~lexer(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
         *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  pcVar2 = (this->token_buffer)._M_dataplus._M_p;
  paVar1 = &(this->token_buffer).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)(this->token_string).
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
  }
  this_00 = (this->ia).
            super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

~lexer() = default;